

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmodel.hpp
# Opt level: O2

bool __thiscall QtMWidgets::ListModel<QImage>::insertRows(ListModel<QImage> *this,int row,int count)

{
  long lVar1;
  ListModelPrivate<QImage> *pLVar2;
  ulong uVar3;
  long i;
  long lVar4;
  bool bVar5;
  QImage local_48 [24];
  
  lVar4 = (long)row;
  lVar1 = (((this->d).d)->data).d.size;
  if (lVar4 <= lVar1) {
    uVar3 = 0;
    if (0 < count) {
      uVar3 = (ulong)(uint)count;
    }
    i = lVar4;
    while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
      pLVar2 = (this->d).d;
      QImage::QImage(local_48);
      QList<QImage>::emplace<QImage>(&pLVar2->data,i,local_48);
      QImage::~QImage(local_48);
      i = i + 1;
    }
    AbstractListModel::rowsInserted(&this->super_AbstractListModel,row,row + count + -1);
  }
  return lVar4 <= lVar1;
}

Assistant:

virtual bool insertRows( int row, int count )
	{
		if( row > d->data.count() )
			return false;

		for( int i = 0; i < count; ++i )
			d->data.insert( row + i, T() );

		emit rowsInserted( row, row + count - 1 );

		return true;
	}